

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularMessage::GenerateDestructorCode
          (SingularMessage *this,Printer *p)

{
  if ((this->super_FieldGeneratorBase).should_split_ == true) {
    io::Printer::Emit(p,0x2f,"\n      delete $cached_split_ptr$->$name$_;\n    ");
    return;
  }
  io::Printer::Emit(p,0x22,"\n      delete this_.$field_$;\n    ");
  return;
}

Assistant:

void SingularMessage::GenerateDestructorCode(io::Printer* p) const {
  if (should_split()) {
    p->Emit(R"cc(
      delete $cached_split_ptr$->$name$_;
    )cc");
  } else {
    p->Emit(R"cc(
      delete this_.$field_$;
    )cc");
  }
}